

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

void __thiscall RegressionTree::genDynamicFunctions(RegressionTree *this)

{
  bool bVar1;
  Attribute *pAVar2;
  ostream *poVar3;
  size_t sVar4;
  _Ios_Openmode _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_468;
  Function *local_448;
  size_t local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  RegressionTree *local_3f8;
  string functionSource;
  string functionHeaders;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&functionHeaders,"",(allocator *)&ofs);
  std::__cxx11::string::string((string *)&functionSource,"",(allocator *)&ofs);
  sVar4 = 0;
  local_3f8 = this;
  while (sVar4 != 0x5dc) {
    local_440 = sVar4;
    bVar1 = std::bitset<1500UL>::test
                      ((this->_candidateMask).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 100,sVar4);
    if (bVar1) {
      local_448 = QueryCompiler::getFunction
                            ((this->_compiler).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             local_440);
      std::__cxx11::string::string((string *)&ofs,"",(allocator *)&bStack_468);
      sVar4 = 0;
      while( true ) {
        if (sVar4 == 100) break;
        bVar1 = std::bitset<100UL>::test(&local_448->_fVars,sVar4);
        if (bVar1) {
          pAVar2 = TreeDecomposition::getAttribute
                             ((this->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,sVar4);
          Application::typeToStr_abi_cxx11_(&local_350,&this->super_Application,pAVar2->_type);
          std::operator+(&local_418,&local_350," ");
          std::operator+(&local_438,&local_418,&pAVar2->_name);
          std::operator+(&bStack_468,&local_438,",");
          std::__cxx11::string::append((string *)&ofs);
          std::__cxx11::string::~string((string *)&bStack_468);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_350);
          this = local_3f8;
        }
        sVar4 = sVar4 + 1;
      }
      std::__cxx11::string::pop_back();
      Application::offset_abi_cxx11_(&local_390,&this->super_Application,1);
      std::operator+(&local_370,&local_390,"double ");
      local_448 = (Function *)&local_448->_name;
      std::operator+(&local_350,&local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448)
      ;
      std::operator+(&local_418,&local_350,"(");
      std::operator+(&local_438,&local_418,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
      std::operator+(&bStack_468,&local_438,");\n\n");
      std::__cxx11::string::append((string *)&functionHeaders);
      std::__cxx11::string::~string((string *)&bStack_468);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      Application::offset_abi_cxx11_(&local_2d0,&this->super_Application,1);
      std::operator+(&local_2b0,&local_2d0,"double ");
      std::operator+(&local_290,&local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448)
      ;
      std::operator+(&local_270,&local_290,"(");
      std::operator+(&local_250,&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
      std::operator+(&local_3b0,&local_250,")\n");
      Application::offset_abi_cxx11_(&local_2f0,&this->super_Application,1);
      std::operator+(&local_390,&local_3b0,&local_2f0);
      std::operator+(&local_370,&local_390,"{\n");
      Application::offset_abi_cxx11_(&local_310,&this->super_Application,2);
      std::operator+(&local_350,&local_370,&local_310);
      std::operator+(&local_418,&local_350,"return 1.0;\n");
      Application::offset_abi_cxx11_(&local_330,&this->super_Application,1);
      std::operator+(&local_438,&local_418,&local_330);
      std::operator+(&bStack_468,&local_438,"}\n");
      std::__cxx11::string::append((string *)&functionSource);
      std::__cxx11::string::~string((string *)&bStack_468);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&ofs);
    }
    sVar4 = local_440 + 1;
  }
  std::operator+(&bStack_468,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"DynamicFunctions.h");
  std::ofstream::ofstream(&ofs,(string *)&bStack_468,_S_out);
  std::__cxx11::string::~string((string *)&bStack_468);
  poVar3 = std::operator<<((ostream *)&ofs,"#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n");
  poVar3 = std::operator<<(poVar3,"#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n");
  poVar3 = std::operator<<(poVar3,"namespace lmfao\n{\n");
  poVar3 = std::operator<<(poVar3,(string *)&functionHeaders);
  std::operator<<(poVar3,"}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n");
  std::ofstream::close();
  std::operator+(&bStack_468,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"DynamicFunctions.cpp");
  _Var5 = (_Ios_Openmode)&bStack_468;
  std::ofstream::open((string *)&ofs,_Var5);
  std::__cxx11::string::~string((string *)&bStack_468);
  std::operator+(&local_438,"#include \"DynamicFunctions.h\"\nnamespace lmfao\n{\n",&functionSource)
  ;
  std::operator+(&bStack_468,&local_438,"}\n");
  std::operator<<((ostream *)&ofs,(string *)&bStack_468);
  std::__cxx11::string::~string((string *)&bStack_468);
  std::__cxx11::string::~string((string *)&local_438);
  std::ofstream::close();
  std::operator+(&bStack_468,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"DynamicFunctionsGenerator.hpp");
  std::ofstream::open((string *)&ofs,_Var5);
  std::__cxx11::string::~string((string *)&bStack_468);
  dynamicFunctionsGenerator_abi_cxx11_(&bStack_468,this);
  std::operator<<((ostream *)&ofs,(string *)&bStack_468);
  std::__cxx11::string::~string((string *)&bStack_468);
  std::ofstream::close();
  std::operator+(&bStack_468,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"RegressionTreeHelper.hpp");
  std::ofstream::open((string *)&ofs,_Var5);
  std::__cxx11::string::~string((string *)&bStack_468);
  dynamicFunctionsGenerator_abi_cxx11_(&bStack_468,this);
  std::operator<<((ostream *)&ofs,(string *)&bStack_468);
  std::__cxx11::string::~string((string *)&bStack_468);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&functionSource);
  std::__cxx11::string::~string((string *)&functionHeaders);
  return;
}

Assistant:

void RegressionTree::genDynamicFunctions()
{
    std::string functionHeaders = "";
    std::string functionSource = "";
    for(size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
    {   
        if (_candidateMask[NUM_OF_VARIABLES].test(f))
        {
            Function* func = _compiler->getFunction(f);
            const var_bitset& fVars = func->_fVars;
            std::string fvarString = "";
            
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (fVars.test(var))
                {
                    Attribute* att = _td->getAttribute(var);
                    fvarString += typeToStr(att->_type)+" "+att->_name+",";
                }
            }
            fvarString.pop_back();
            functionHeaders += offset(1)+"double "+func->_name+"("+fvarString+");\n\n";
            functionSource += offset(1)+"double "+func->_name+"("+fvarString+")\n"+
                offset(1)+"{\n"+offset(2)+"return 1.0;\n"+offset(1)+"}\n";
        }
    }
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n"<<
        "#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n"<<
        "namespace lmfao\n{\n"<< functionHeaders <<
        "}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n";    
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.cpp", std::ofstream::out);
    ofs << "#include \"DynamicFunctions.h\"\nnamespace lmfao\n{\n"+functionSource+"}\n";
    ofs.close();


    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctionsGenerator.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"RegressionTreeHelper.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();
}